

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexpr.h
# Opt level: O1

SExpr * SExprParseValue(SExprParser *parser)

{
  int *piVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  SExpr *pSVar8;
  SExpr *pSVar9;
  anon_union_8_5_1f899604_for_SExpr_2 *paVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  SExpr *pSVar15;
  bool bVar16;
  bool bVar17;
  double dVar18;
  char buf [32];
  char local_58 [40];
  
  iVar14 = parser->last;
  bVar16 = iVar14 == 0;
  if (!bVar16) {
    iVar4 = isspace(iVar14);
    if (iVar4 != 0) {
      uVar13 = parser->len;
      iVar4 = parser->pos;
      do {
        if (iVar14 == 10) {
          parser->lineNumber = parser->lineNumber + 1;
        }
        uVar6 = (ulong)iVar4;
        iVar14 = 0;
        if (uVar6 < uVar13) {
          iVar4 = iVar4 + 1;
          parser->pos = iVar4;
          iVar14 = (int)parser->src[uVar6];
        }
        parser->last = iVar14;
        bVar16 = iVar14 == 0;
        if (bVar16) goto LAB_0010c769;
        iVar5 = isspace(iVar14);
      } while (iVar5 != 0);
    }
    if (!bVar16) {
      iVar4 = isalpha(iVar14);
      if (iVar4 == 0) {
        if (iVar14 - 0x30U < 10) {
LAB_0010c8f6:
          iVar14 = parser->last;
          lVar11 = 0;
          bVar16 = false;
          while( true ) {
            if (((9 < iVar14 - 0x30U) && (iVar14 != 0x2d)) &&
               (!(bool)(iVar14 == 0x2e & (bVar16 ^ 1U)))) {
              local_58[lVar11] = '\0';
              if (bVar16) {
                pSVar15 = SExprAlloc(parser,SE_FLOAT);
                dVar18 = strtod(local_58,(char **)0x0);
                (pSVar15->field_2).f = (float)dVar18;
                return pSVar15;
              }
              pSVar15 = SExprAlloc(parser,SE_INT);
              lVar11 = strtol(local_58,(char **)0x0,10);
              (pSVar15->field_2).i = (int)lVar11;
              return pSVar15;
            }
            if (lVar11 == 0x1f) break;
            if (iVar14 == 0x2e) {
              bVar16 = true;
            }
            local_58[lVar11] = (char)iVar14;
            iVar4 = parser->pos;
            iVar14 = 0;
            if ((ulong)(long)iVar4 < parser->len) {
              parser->pos = iVar4 + 1;
              iVar14 = (int)parser->src[iVar4];
            }
            parser->last = iVar14;
            lVar11 = lVar11 + 1;
          }
          (parser->result).type = SE_SYNTAX_ERROR;
          pcVar7 = "Numeric literal is too long.";
          goto LAB_0010c777;
        }
        if (iVar14 < 0x2d) {
LAB_0010c9dd:
          if (iVar14 == 0x22) {
            pSVar15 = SExprAlloc(parser,SE_STRING);
            (pSVar15->field_2).s.len = 0;
            (pSVar15->field_2).i = parser->pos;
            while( true ) {
              iVar14 = parser->pos;
              iVar4 = 0;
              if ((ulong)(long)iVar14 < parser->len) {
                parser->pos = iVar14 + 1;
                iVar4 = (int)parser->src[iVar14];
              }
              parser->last = iVar4;
              if (iVar4 == 0) break;
              if (iVar4 == 0x22) {
                iVar14 = parser->pos;
                iVar4 = 0;
                if ((ulong)(long)iVar14 < parser->len) {
                  parser->pos = iVar14 + 1;
                  iVar4 = (int)parser->src[iVar14];
                }
                parser->last = iVar4;
                return pSVar15;
              }
              piVar1 = &(pSVar15->field_2).s.len;
              *piVar1 = *piVar1 + 1;
            }
            (parser->result).type = SE_SYNTAX_ERROR;
            pcVar7 = "Unexpected EOF when expecting end of string.";
            goto LAB_0010c777;
          }
          if (iVar14 != 0x28) goto LAB_0010cbae;
        }
        else if ((iVar14 != 0x7b) && (iVar14 != 0x5b)) {
          if (iVar14 == 0x2d) {
            if (((ulong)(long)parser->pos < parser->len) &&
               ((int)parser->src[parser->pos] - 0x30U < 10)) goto LAB_0010c8f6;
            goto LAB_0010c9dd;
          }
LAB_0010cbae:
          (parser->result).type = SE_SYNTAX_ERROR;
          pcVar7 = "Unexpected character";
          goto LAB_0010c777;
        }
        iVar14 = parser->pos;
        uVar13 = parser->len;
        while( true ) {
          iVar4 = 0;
          if ((ulong)(long)iVar14 < uVar13) {
            parser->pos = iVar14 + 1;
            iVar4 = (int)parser->src[iVar14];
          }
          parser->last = iVar4;
          if (iVar4 == 0) goto LAB_0010cafb;
          iVar14 = isspace(iVar4);
          if (iVar14 == 0) break;
          if (iVar4 == 10) {
            parser->lineNumber = parser->lineNumber + 1;
          }
          iVar14 = parser->pos;
        }
        if (0x5c < iVar4) {
          if ((iVar4 == 0x5d) || (iVar4 == 0x7d)) {
LAB_0010cb73:
            iVar14 = parser->pos;
            iVar4 = 0;
            if ((ulong)(long)iVar14 < uVar13) {
              parser->pos = iVar14 + 1;
              iVar4 = (int)parser->src[iVar14];
            }
            parser->last = iVar4;
            return &SExprParseValue::nil;
          }
LAB_0010cbc1:
          pSVar8 = SExprAlloc(parser,SE_LIST);
          pSVar15 = (SExpr *)0x0;
          do {
            iVar14 = parser->last;
            if (iVar14 < 0x5d) {
              if (iVar14 == 0) {
                (parser->result).type = SE_SYNTAX_ERROR;
                pcVar7 = "Unexpected EOF when expecting end of list.";
                goto LAB_0010c777;
              }
              if (iVar14 == 0x29) goto LAB_0010cc61;
            }
            else if ((iVar14 == 0x5d) || (iVar14 == 0x7d)) {
LAB_0010cc61:
              iVar14 = parser->pos;
              iVar4 = 0;
              if ((ulong)(long)iVar14 < parser->len) {
                parser->pos = iVar14 + 1;
                iVar4 = (int)parser->src[iVar14];
              }
              parser->last = iVar4;
              return pSVar8;
            }
            pSVar9 = SExprParseValue(parser);
            if (pSVar9 != (SExpr *)0x0) {
              paVar10 = (anon_union_8_5_1f899604_for_SExpr_2 *)&pSVar15->next;
              if (pSVar15 == (SExpr *)0x0) {
                paVar10 = &pSVar8->field_2;
              }
              paVar10->head = pSVar9;
              iVar14 = parser->last;
              while ((pSVar15 = pSVar9, iVar14 != 0 && (iVar4 = isspace(iVar14), iVar4 != 0))) {
                if (iVar14 == 10) {
                  parser->lineNumber = parser->lineNumber + 1;
                }
                iVar4 = parser->pos;
                iVar14 = 0;
                if ((ulong)(long)iVar4 < parser->len) {
                  parser->pos = iVar4 + 1;
                  iVar14 = (int)parser->src[iVar4];
                }
                parser->last = iVar14;
              }
            }
            if (pSVar9 == (SExpr *)0x0) {
              return (SExpr *)0x0;
            }
          } while( true );
        }
        if (iVar4 != 0) {
          if (iVar4 == 0x29) goto LAB_0010cb73;
          goto LAB_0010cbc1;
        }
LAB_0010cafb:
        (parser->result).type = SE_SYNTAX_ERROR;
        pcVar7 = "Unexpected EOF when expecting \')\' or list elements.";
        goto LAB_0010c777;
      }
      iVar14 = parser->pos;
      iVar4 = parser->last;
      uVar6 = (ulong)(iVar14 - 1);
      uVar13 = 0;
      while ((iVar5 = isalnum(iVar4), iVar5 != 0 ||
             ((iVar4 - 0x24U < 0x3c &&
              ((0x80000000a000ac1U >> ((ulong)(iVar4 - 0x24U) & 0x3f) & 1) != 0))))) {
        iVar5 = parser->pos;
        iVar4 = 0;
        if ((ulong)(long)iVar5 < parser->len) {
          parser->pos = iVar5 + 1;
          iVar4 = (int)parser->src[iVar5];
        }
        parser->last = iVar4;
        uVar13 = uVar13 + 1;
        uVar6 = uVar6 + 0x100000000;
      }
      pcVar7 = parser->src;
      lVar11 = uVar13 - 1;
      bVar17 = (int)uVar13 == 0;
      bVar16 = bVar17;
      if (bVar17) {
LAB_0010c86e:
        if (bVar16) {
          SExprParseValue::strue.field_2.b = true;
          return &SExprParseValue::strue;
        }
      }
      else if (pcVar7[(long)iVar14 + -1] == 't') {
        lVar3 = 0;
        do {
          lVar12 = lVar3;
          if ((lVar11 == lVar12) || (lVar12 == 3)) break;
          lVar3 = lVar12 + 1;
        } while (pcVar7[iVar14 + (int)lVar12] == "true"[lVar12 + 1]);
        bVar16 = uVar13 <= lVar12 + 1U;
        goto LAB_0010c86e;
      }
      if ((int)uVar13 != 0) {
        if (pcVar7[(long)iVar14 + -1] != 'f') goto LAB_0010c961;
        lVar3 = 0;
        do {
          lVar12 = lVar3;
          bVar16 = lVar11 == 0;
          lVar11 = lVar11 + -1;
          if ((bVar16) || (lVar12 == 4)) break;
          lVar3 = lVar12 + 1;
        } while (pcVar7[iVar14 + (int)lVar12] == "false"[lVar12 + 1]);
        bVar17 = uVar13 <= lVar12 + 1U;
      }
      if (bVar17) {
        SExprParseValue::sfalse.field_2.b = false;
        return &SExprParseValue::sfalse;
      }
LAB_0010c961:
      sVar2 = parser->poolUsed;
      if (parser->pool == (SExprPool *)0x0) {
        parser->poolUsed = sVar2 + 1;
        pSVar15 = &SExprAlloc::dummy;
      }
      else {
        pSVar15 = parser->pool->data;
        parser->poolUsed = sVar2 + 1;
        pSVar15 = pSVar15 + sVar2;
        pSVar15->type = SE_ID;
        pSVar15->next = (SExpr *)0x0;
      }
      *(ulong *)&(pSVar15->field_2).b = uVar6;
      return pSVar15;
    }
  }
LAB_0010c769:
  (parser->result).type = SE_SYNTAX_ERROR;
  pcVar7 = "Unexpected EOF";
LAB_0010c777:
  (parser->result).field_1.expr = (SExpr *)pcVar7;
  return (SExpr *)0x0;
}

Assistant:

SEXPR_DEF SExpr* SExprParseValue(SExprParser* parser)
{
    while(parser->last && isspace(parser->last)) {
        if(parser->last == '\n') {
            parser->lineNumber++;
        }

        parser->last = SExprGetChar(parser);
    }

    if(!parser->last) {
        parser->result.type = SE_SYNTAX_ERROR;
        parser->result.syntaxError.message = "Unexpected EOF";

        return NULL;
    }

    if(isalpha(parser->last)) {
        SExprString s;

        s.len = 0;
        s.start = parser->pos - 1;

        while(isalnum(parser->last) || parser->last == '-' ||
                parser->last == '+' || parser->last == '/' ||
                parser->last == '*' || parser->last == '$' ||
                parser->last == '?' || parser->last == '_' ||
                parser->last == '=') {
            s.len++;
            parser->last = SExprGetChar(parser);
        }

        if(SExprStringEqual(parser->src, &s, "true")) {
            static SExpr strue = {SE_BOOL};
            strue.b = true;

            return &strue;
        } else if(SExprStringEqual(parser->src, &s, "false")) {
            static SExpr sfalse = {SE_BOOL};
            sfalse.b = false;
            
            return &sfalse;
        }

        SExpr* expr = SExprAlloc(parser, SE_ID);
        expr->s = s;

        return expr;
    } else if(isdigit(parser->last) || (parser->last == '-' && isdigit(SExprPeek(parser)))) {
        int i = 0;
        char buf[32];

        bool isFloat = false;

        while(isdigit(parser->last) || (!isFloat && parser->last == '.') || parser->last == '-') {
            if(i >= sizeof(buf) - 1) {
                parser->result.type = SE_SYNTAX_ERROR;
                parser->result.syntaxError.message = "Numeric literal is too long.";
                return NULL;
            }

            if(parser->last == '.') {
                isFloat = true;
            }

            buf[i++] = parser->last;
            parser->last = SExprGetChar(parser);
        }

        buf[i] = '\0';

        if(isFloat) {
            SExpr* expr = SExprAlloc(parser, SE_FLOAT);
            expr->f = (float)strtod(buf, NULL);
            return expr;
        }    

        SExpr* expr = SExprAlloc(parser, SE_INT);
        expr->i = strtol(buf, NULL, 10);
        return expr;
    } else if(parser->last == '"') {
        SExpr* expr = SExprAlloc(parser, SE_STRING);

        expr->s.len = 0;
        expr->s.start = parser->pos;

        parser->last = SExprGetChar(parser);

        while(parser->last && parser->last != '"') {
            expr->s.len++;
            parser->last = SExprGetChar(parser);
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting end of string.";
            return NULL;
        }

        parser->last = SExprGetChar(parser);

        return expr;
    } else if(parser->last == '(' || parser->last == '[' || parser->last == '{') {
        parser->last = SExprGetChar(parser);

        while(parser->last && isspace(parser->last)) {
			if(parser->last == '\n') {
				parser->lineNumber++;
			}
            parser->last = SExprGetChar(parser);
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting ')' or list elements.";
            return NULL;
        }

        if(parser->last == ')' || parser->last == ']' || parser->last == '}') {
            parser->last = SExprGetChar(parser);
            
            static SExpr nil = {SE_NIL};
            return &nil;
        }

        SExpr* list = SExprAlloc(parser, SE_LIST);
        SExpr* tail = NULL;

        while(parser->last && parser->last != ')' && parser->last != ']' && parser->last != '}') {
            SExpr* elem = SExprParseValue(parser);

            if(!elem) {
                // There must have been an error
                return NULL;
            }

            if(!tail) {
                list->head = tail = elem;
            } else {
                tail->next = elem;
				tail = elem;
            }

			while(parser->last && isspace(parser->last)) {		
				if(parser->last == '\n') {
					parser->lineNumber++;
				}
				parser->last = SExprGetChar(parser);
			}
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting end of list.";
            return NULL;
        }

        parser->last = SExprGetChar(parser);

        return list;
    }

    parser->result.type = SE_SYNTAX_ERROR;
    parser->result.syntaxError.message = "Unexpected character";
    return NULL;
}